

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O2

ImVec2_Simple igGetCursorScreenPos_nonUDT2(void)

{
  ImVec2 IVar1;
  
  IVar1 = ImGui::GetCursorScreenPos();
  return (ImVec2_Simple)IVar1;
}

Assistant:

CIMGUI_API ImVec2_Simple *_igGetCursorScreenPos_nonUDT2 () {
  ImVec2_Simple * lresult = (ImVec2_Simple *)0 ;
  ImVec2_Simple result;
  
  try {
    result = igGetCursorScreenPos_nonUDT2();
    lresult = new ImVec2_Simple(result);
    return lresult;
  } catch (...) {
    return (ImVec2_Simple *)0;
  }
}